

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O2

void __thiscall
sznet::detail::ThreadNameInitializer::ThreadNameInitializer(ThreadNameInitializer *this)

{
  undefined8 *puVar1;
  sz_pid_t sVar2;
  
  this->m_mainPid = 0;
  puVar1 = (undefined8 *)CurrentThread::t_threadName();
  *puVar1 = "main";
  sVar2 = CurrentThread::tid();
  this->m_mainPid = sVar2;
  return;
}

Assistant:

ThreadNameInitializer()
	{
		// 设置主线程名称
		sznet::CurrentThread::t_threadName = "main";
		// 缓存线程id
		m_mainPid = CurrentThread::tid();
	}